

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfChannelListAttribute.cpp
# Opt level: O0

void __thiscall
Imf_2_5::TypedAttribute<Imf_2_5::ChannelList>::writeValueTo
          (TypedAttribute<Imf_2_5::ChannelList> *this,OStream *os,int version)

{
  bool bVar1;
  OStream *in_RSI;
  ConstIterator i;
  OStream *in_stack_ffffffffffffffa8;
  OStream *in_stack_ffffffffffffffb0;
  
  ChannelList::begin((ChannelList *)in_stack_ffffffffffffffa8);
  while( true ) {
    ChannelList::end((ChannelList *)in_stack_ffffffffffffffa8);
    bVar1 = Imf_2_5::operator!=((ConstIterator *)in_stack_ffffffffffffffb0,
                                (ConstIterator *)in_stack_ffffffffffffffa8);
    if (!bVar1) break;
    in_stack_ffffffffffffffa8 = in_RSI;
    ChannelList::ConstIterator::name((ConstIterator *)0x819fa8);
    Xdr::write<Imf_2_5::StreamIO,Imf_2_5::OStream>
              (in_stack_ffffffffffffffb0,(char *)in_stack_ffffffffffffffa8);
    in_stack_ffffffffffffffb0 = in_RSI;
    ChannelList::ConstIterator::channel((ConstIterator *)0x819fc8);
    Xdr::write<Imf_2_5::StreamIO,Imf_2_5::OStream>
              (in_stack_ffffffffffffffb0,(int)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
    ChannelList::ConstIterator::channel((ConstIterator *)0x819fe8);
    Xdr::write<Imf_2_5::StreamIO,Imf_2_5::OStream>
              (in_stack_ffffffffffffffb0,SUB81((ulong)in_stack_ffffffffffffffa8 >> 0x38,0));
    Xdr::pad<Imf_2_5::StreamIO,Imf_2_5::OStream>
              (in_stack_ffffffffffffffb0,(int)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
    ChannelList::ConstIterator::channel((ConstIterator *)0x81a01d);
    Xdr::write<Imf_2_5::StreamIO,Imf_2_5::OStream>
              (in_stack_ffffffffffffffb0,(int)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
    ChannelList::ConstIterator::channel((ConstIterator *)0x81a03e);
    Xdr::write<Imf_2_5::StreamIO,Imf_2_5::OStream>
              (in_stack_ffffffffffffffb0,(int)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
    ChannelList::ConstIterator::operator++((ConstIterator *)in_stack_ffffffffffffffb0);
  }
  Xdr::write<Imf_2_5::StreamIO,Imf_2_5::OStream>
            (in_stack_ffffffffffffffb0,(char *)in_stack_ffffffffffffffa8);
  return;
}

Assistant:

void
ChannelListAttribute::writeValueTo (OStream &os, int version) const
{
    for (ChannelList::ConstIterator i = _value.begin();
	 i != _value.end();
	 ++i)
    {
	//
	// Write name
	//

	Xdr::write <StreamIO> (os, i.name());

	//
	// Write Channel struct
	//

	Xdr::write <StreamIO> (os, int (i.channel().type));
	Xdr::write <StreamIO> (os, i.channel().pLinear);
	Xdr::pad   <StreamIO> (os, 3);
	Xdr::write <StreamIO> (os, i.channel().xSampling);
	Xdr::write <StreamIO> (os, i.channel().ySampling);
    }

    //
    // Write end of list marker
    //

    Xdr::write <StreamIO> (os, "");
}